

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestHugeFieldNumbers_OptionalGroup::ByteSizeLong
          (TestHugeFieldNumbers_OptionalGroup *this)

{
  int32_t value;
  uint32_t *puVar1;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestHugeFieldNumbers_OptionalGroup *this_;
  TestHugeFieldNumbers_OptionalGroup *this_local;
  
  sStack_20 = 0;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    value = _internal_group_a(this);
    sStack_20 = google::protobuf::internal::WireFormatLite::Int32Size(value);
    sStack_20 = sStack_20 + 5;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestHugeFieldNumbers_OptionalGroup::ByteSizeLong() const {
  const TestHugeFieldNumbers_OptionalGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestHugeFieldNumbers.OptionalGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 group_a = 536870009;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_group_a());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}